

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

bool __thiscall CMU462::DynamicScene::Scene::addObject(Scene *this,SceneObject *o)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  SceneObject *local_30;
  
  local_30 = o;
  iVar2 = std::
          _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          ::find(&(this->objects)._M_t,&local_30);
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
    local_30->scene = this;
    (**local_30->_vptr_SceneObject)
              (local_30,this->defaultStyle,this->hoveredStyle,this->selectedStyle);
    std::
    _Rb_tree<CMU462::DynamicScene::SceneObject*,CMU462::DynamicScene::SceneObject*,std::_Identity<CMU462::DynamicScene::SceneObject*>,std::less<CMU462::DynamicScene::SceneObject*>,std::allocator<CMU462::DynamicScene::SceneObject*>>
    ::_M_insert_unique<CMU462::DynamicScene::SceneObject*const&>
              ((_Rb_tree<CMU462::DynamicScene::SceneObject*,CMU462::DynamicScene::SceneObject*,std::_Identity<CMU462::DynamicScene::SceneObject*>,std::less<CMU462::DynamicScene::SceneObject*>,std::allocator<CMU462::DynamicScene::SceneObject*>>
                *)&this->objects,&local_30);
  }
  return (_Rb_tree_header *)iVar2._M_node == p_Var1;
}

Assistant:

bool Scene::addObject( SceneObject* o )
{
   auto i = objects.find( o );
   if( i != objects.end() )
   {
      return false;
   }

   o->scene = this;
   o->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
   objects.insert( o );
   return true;
}